

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

MemoryInit * __thiscall MixedArena::alloc<wasm::MemoryInit>(MixedArena *this)

{
  MemoryInit *pMVar1;
  
  pMVar1 = (MemoryInit *)allocSpace(this,0x48,8);
  *(undefined8 *)&(pMVar1->super_SpecificExpression<(wasm::Expression::Id)36>).super_Expression = 0;
  (pMVar1->super_SpecificExpression<(wasm::Expression::Id)36>).super_Expression.type.id = 0;
  (pMVar1->segment).super_IString.str._M_len = 0;
  (pMVar1->segment).super_IString.str._M_str = (char *)0x0;
  pMVar1->size = (Expression *)0x0;
  pMVar1->dest = (Expression *)0x0;
  pMVar1->offset = (Expression *)0x0;
  (pMVar1->super_SpecificExpression<(wasm::Expression::Id)36>).super_Expression._id = MemoryInitId;
  (pMVar1->memory).super_IString.str._M_len = 0;
  (pMVar1->memory).super_IString.str._M_str = (char *)0x0;
  (pMVar1->super_SpecificExpression<(wasm::Expression::Id)36>).super_Expression.type.id = 0;
  (pMVar1->segment).super_IString.str._M_len = 0;
  (pMVar1->segment).super_IString.str._M_str = (char *)0x0;
  return pMVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }